

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

string * MovementToStr_abi_cxx11_(string *__return_storage_ptr__,Movement move)

{
  uint pos;
  uint pos_00;
  string sStack_38;
  
  pos_00 = move._0_4_ & 0xff;
  pos = move._1_4_ & 0xff;
  if (pos_00 == pos) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"   0",(allocator *)&sStack_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_38);
    IntToStr_abi_cxx11_(&sStack_38,pos_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    IntToStr_abi_cxx11_(&sStack_38,pos);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MovementToStr (const Movement move ) {
	if (move.from == move.to) {
		return "   0";
	}
	std::string s = "";
	s += IntToStr (move.from);
	s += IntToStr (move.to);
	return s;
}